

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateInfoSetBroker(HelicsFederateInfo fedInfo,char *broker,HelicsError *err)

{
  FederateInfo *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  FederateInfo *info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  HelicsFederateInfo in_stack_ffffffffffffffa8;
  bool local_42;
  allocator<char> local_41 [17];
  undefined8 in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  this = getFedInfo(in_stack_ffffffffffffffa8,(HelicsError *)in_stack_ffffffffffffffa0);
  if (this != (FederateInfo *)0x0) {
    local_42 = in_RSI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_42) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 in_stack_ffffffffffffffd8);
    }
    else {
      in_stack_ffffffffffffffa0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)in_stack_ffffffffffffffd8,(allocator<char> *)in_stack_ffffffffffffffd0);
      in_stack_ffffffffffffff98 = in_RSI;
    }
    local_42 = !local_42;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::__cxx11::string::~string(in_stack_ffffffffffffffa0);
    if (local_42) {
      std::allocator<char>::~allocator(local_41);
    }
  }
  return;
}

Assistant:

void helicsFederateInfoSetBroker(HelicsFederateInfo fedInfo, const char* broker, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    try {
        info->broker = AS_STRING(broker);
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}